

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmFunctionAccess(LlvmCompilationContext *ctx,ExprFunctionAccess *node)

{
  LLVMValueRefOpaque **ppLVar1;
  LLVMValueRef pLVar2;
  
  ppLVar1 = SmallArray<LLVMValueRefOpaque_*,_128U>::operator[]
                      (&ctx->functions,node->function->functionIndex);
  if (*ppLVar1 != (LLVMValueRefOpaque *)0x0) {
    if (node->context == (ExprBase *)0x0) {
      CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    }
    else {
      CompileLlvm(ctx,node->context);
    }
    SmallArray<LLVMValueRefOpaque_*,_128U>::operator[]
              (&ctx->functions,node->function->functionIndex);
    CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    CompileLlvmType(ctx,(node->super_ExprBase).type);
    pLVar2 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)&placeholderValue);
    return pLVar2;
  }
  __assert_fail("ctx.functions[node->function->functionIndex]",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x732,
                "LLVMValueRef CompileLlvmFunctionAccess(LlvmCompilationContext &, ExprFunctionAccess *)"
               );
}

Assistant:

LLVMValueRef CompileLlvmFunctionAccess(LlvmCompilationContext &ctx, ExprFunctionAccess *node)
{
	assert(ctx.functions[node->function->functionIndex]);

	LLVMValueRef context = node->context ? CompileLlvm(ctx, node->context) : LLVMConstPointerNull(CompileLlvmType(ctx, ctx.ctx.typeNullPtr));
	LLVMValueRef function = ctx.functions[node->function->functionIndex];

	context = LLVMBuildPointerCast(ctx.builder, context, CompileLlvmType(ctx, ctx.ctx.typeNullPtr), "context_ptr");
	function = LLVMBuildPointerCast(ctx.builder, function, CompileLlvmType(ctx, ctx.ctx.typeNullPtr), "func_ptr");

	LLVMValueRef constants[] = { LLVMConstPointerNull(CompileLlvmType(ctx, ctx.ctx.typeNullPtr)), LLVMConstPointerNull(CompileLlvmType(ctx, ctx.ctx.typeNullPtr)) };

	LLVMValueRef result = LLVMConstNamedStruct(CompileLlvmType(ctx, node->type), constants, 2);

	result = LLVMBuildInsertValue(ctx.builder, result, context, 0, "");
	result = LLVMBuildInsertValue(ctx.builder, result, function, 1, "");

	return CheckType(ctx, node, result);
}